

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_def.c
# Opt level: O0

int Connect_Fields(FORM *form,FIELD **fields)

{
  unsigned_short uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  FIELD *local_48;
  FIELD *fld;
  _PAGE *pg;
  int maximum_col_in_field;
  int maximum_row_in_field;
  int page_nr;
  int j;
  int field_cnt;
  FIELD **fields_local;
  FORM *form_local;
  
  if (form == (FORM *)0x0) {
    __assert_fail("form != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CursesDialog/form/frm_def.c"
                  ,0x9f,"int Connect_Fields(FORM *, FIELD **)");
  }
  form->field = fields;
  form->maxfield = 0;
  form->maxpage = 0;
  if (fields == (FIELD **)0x0) {
    piVar4 = __errno_location();
    *piVar4 = 0;
    form_local._4_4_ = 0;
  }
  else {
    maximum_col_in_field = 0;
    for (page_nr = 0; fields[page_nr] != (FIELD *)0x0; page_nr = page_nr + 1) {
      if (fields[page_nr]->form != (formnode *)0x0) {
        piVar4 = __errno_location();
        *piVar4 = -4;
        return -4;
      }
      if ((page_nr == 0) || ((fields[page_nr]->status & 4) != 0)) {
        maximum_col_in_field = maximum_col_in_field + 1;
      }
      fields[page_nr]->form = form;
    }
    if (page_nr == 0) {
      piVar4 = __errno_location();
      *piVar4 = -2;
      form_local._4_4_ = -2;
    }
    else {
      fld = (FIELD *)malloc((long)maximum_col_in_field << 3);
      if (fld == (FIELD *)0x0) {
        piVar4 = __errno_location();
        *piVar4 = -1;
        form_local._4_4_ = -1;
      }
      else {
        form->page = (_PAGE *)fld;
        for (maximum_row_in_field = 0; maximum_row_in_field < page_nr;
            maximum_row_in_field = maximum_row_in_field + 1) {
          uVar1 = (unsigned_short)maximum_row_in_field;
          if (maximum_row_in_field == 0) {
            fld->status = uVar1;
          }
          else if ((fields[maximum_row_in_field]->status & 4) != 0) {
            fld->rows = uVar1 - 1;
            fld = (FIELD *)&fld->fcol;
            *(unsigned_short *)fld = uVar1;
          }
          iVar2 = (int)fields[maximum_row_in_field]->frow + (int)fields[maximum_row_in_field]->rows;
          iVar3 = (int)fields[maximum_row_in_field]->fcol + (int)fields[maximum_row_in_field]->cols;
          if (form->rows < iVar2) {
            form->rows = (short)iVar2;
          }
          if (form->cols < iVar3) {
            form->cols = (short)iVar3;
          }
        }
        fld->rows = (short)page_nr + -1;
        form->maxfield = (short)page_nr;
        form->maxpage = (short)maximum_col_in_field;
        for (maximum_col_in_field = 0; maximum_col_in_field < form->maxpage;
            maximum_col_in_field = maximum_col_in_field + 1) {
          local_48 = (FIELD *)0x0;
          for (maximum_row_in_field = (int)form->page[maximum_col_in_field].pmin;
              maximum_row_in_field <= form->page[maximum_col_in_field].pmax;
              maximum_row_in_field = maximum_row_in_field + 1) {
            fields[maximum_row_in_field]->index = (short)maximum_row_in_field;
            fields[maximum_row_in_field]->page = (short)maximum_col_in_field;
            local_48 = Insert_Field_By_Position(fields[maximum_row_in_field],local_48);
          }
          form->page[maximum_col_in_field].smin = local_48->index;
          form->page[maximum_col_in_field].smax = local_48->sprev->index;
        }
        piVar4 = __errno_location();
        *piVar4 = 0;
        form_local._4_4_ = 0;
      }
    }
  }
  return form_local._4_4_;
}

Assistant:

static int Connect_Fields(FORM  * form, FIELD ** fields)
{
  int field_cnt, j;
  int page_nr;
  int maximum_row_in_field, maximum_col_in_field;
  _PAGE *pg;
  
  assert(form != 0);

  form->field    = fields;
  form->maxfield = 0;
  form->maxpage  = 0;

  if (!fields)
    RETURN(E_OK);
  
  page_nr = 0;
  /* store formpointer in fields and count pages */
  for(field_cnt=0;fields[field_cnt];field_cnt++)
    {
      if (fields[field_cnt]->form) 
	RETURN(E_CONNECTED);
      if ( field_cnt==0 || 
	  (fields[field_cnt]->status & _NEWPAGE)) 
	page_nr++;
      fields[field_cnt]->form = form;
    }	
  if (field_cnt==0)
    RETURN(E_BAD_ARGUMENT);
  
  /* allocate page structures */
  if ( (pg = (_PAGE *)malloc(page_nr * sizeof(_PAGE))) != (_PAGE *)0 )
    {
      form->page = pg;
    }
  else
    RETURN(E_SYSTEM_ERROR);
  
  /* Cycle through fields and calculate page boundaries as well as
     size of the form */
  for(j=0;j<field_cnt;j++)
    {
      if (j==0) 
	pg->pmin = j;
      else
	{
	  if (fields[j]->status & _NEWPAGE)
	    {
	      pg->pmax = j-1;
	      pg++;
	      pg->pmin = j;
	    }
	}
      
      maximum_row_in_field = fields[j]->frow + fields[j]->rows;
      maximum_col_in_field = fields[j]->fcol + fields[j]->cols;
      
      if (form->rows < maximum_row_in_field) 
	form->rows = maximum_row_in_field;
      if (form->cols < maximum_col_in_field) 
	form->cols = maximum_col_in_field;
    }
  
  pg->pmax       = field_cnt-1;
  form->maxfield = field_cnt;
  form->maxpage  = page_nr; 
  
  /* Sort fields on form pages */
  for(page_nr = 0;page_nr < form->maxpage; page_nr++)
    {
      FIELD *fld = (FIELD *)0;
      for(j = form->page[page_nr].pmin;j <= form->page[page_nr].pmax;j++)
	{
	  fields[j]->index = j;
	  fields[j]->page  = page_nr;
	  fld = Insert_Field_By_Position(fields[j],fld);
	}
      form->page[page_nr].smin = fld->index;
      form->page[page_nr].smax = fld->sprev->index;
    }
  RETURN(E_OK);
}